

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::constructBuiltIn
          (HlslParseContext *this,TType *type,TOperator op,TIntermTyped *node,TSourceLoc *loc,
          bool subset)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TOperator local_4c;
  TOperator basicOp;
  TIntermTyped *newNode;
  bool subset_local;
  TSourceLoc *loc_local;
  TIntermTyped *node_local;
  TOperator op_local;
  TType *type_local;
  HlslParseContext *this_local;
  
  switch(op) {
  case EOpConstructInt:
  case EOpConstructIVec2:
  case EOpConstructIVec3:
  case EOpConstructIVec4:
  case EOpConstructIMat2x2:
  case EOpConstructIMat2x3:
  case EOpConstructIMat2x4:
  case EOpConstructIMat3x2:
  case EOpConstructIMat3x3:
  case EOpConstructIMat3x4:
  case EOpConstructIMat4x2:
  case EOpConstructIMat4x3:
  case EOpConstructIMat4x4:
    local_4c = EOpConstructInt;
    break;
  case EOpConstructUint:
  case EOpConstructUVec2:
  case EOpConstructUVec3:
  case EOpConstructUVec4:
  case EOpConstructUMat2x2:
  case EOpConstructUMat2x3:
  case EOpConstructUMat2x4:
  case EOpConstructUMat3x2:
  case EOpConstructUMat3x3:
  case EOpConstructUMat3x4:
  case EOpConstructUMat4x2:
  case EOpConstructUMat4x3:
  case EOpConstructUMat4x4:
    local_4c = EOpConstructUint;
    break;
  default:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unsupported construction","");
    return (TIntermTyped *)0x0;
  case EOpConstructInt16:
  case EOpConstructI16Vec2:
  case EOpConstructI16Vec3:
  case EOpConstructI16Vec4:
    local_4c = EOpConstructInt16;
    break;
  case EOpConstructUint16:
  case EOpConstructU16Vec2:
  case EOpConstructU16Vec3:
  case EOpConstructU16Vec4:
    local_4c = EOpConstructUint16;
    break;
  case EOpConstructBool:
  case EOpConstructBVec2:
  case EOpConstructBVec3:
  case EOpConstructBVec4:
  case EOpConstructBMat2x2:
  case EOpConstructBMat2x3:
  case EOpConstructBMat2x4:
  case EOpConstructBMat3x2:
  case EOpConstructBMat3x3:
  case EOpConstructBMat3x4:
  case EOpConstructBMat4x2:
  case EOpConstructBMat4x3:
  case EOpConstructBMat4x4:
    local_4c = EOpConstructBool;
    break;
  case EOpConstructFloat:
  case EOpConstructVec2:
  case EOpConstructVec3:
  case EOpConstructVec4:
  case EOpConstructMat2x2:
  case EOpConstructMat2x3:
  case EOpConstructMat2x4:
  case EOpConstructMat3x2:
  case EOpConstructMat3x3:
  case EOpConstructMat3x4:
  case EOpConstructMat4x2:
  case EOpConstructMat4x3:
  case EOpConstructMat4x4:
    local_4c = EOpConstructFloat;
    break;
  case EOpConstructDouble:
  case EOpConstructDVec2:
  case EOpConstructDVec3:
  case EOpConstructDVec4:
  case EOpConstructDMat2x2:
  case EOpConstructDMat2x3:
  case EOpConstructDMat2x4:
  case EOpConstructDMat3x2:
  case EOpConstructDMat3x3:
  case EOpConstructDMat3x4:
  case EOpConstructDMat4x2:
  case EOpConstructDMat4x3:
  case EOpConstructDMat4x4:
    local_4c = EOpConstructDouble;
    break;
  case EOpConstructFloat16:
  case EOpConstructF16Vec2:
  case EOpConstructF16Vec3:
  case EOpConstructF16Vec4:
  case EOpConstructF16Mat2x2:
  case EOpConstructF16Mat2x3:
  case EOpConstructF16Mat2x4:
  case EOpConstructF16Mat3x2:
  case EOpConstructF16Mat3x3:
  case EOpConstructF16Mat3x4:
  case EOpConstructF16Mat4x2:
  case EOpConstructF16Mat4x3:
  case EOpConstructF16Mat4x4:
    local_4c = EOpConstructFloat16;
  }
  this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  this_local = (HlslParseContext *)
               TIntermediate::addUnaryMath
                         (this_00,local_4c,node,(TSourceLoc *)CONCAT44(extraout_var,iVar2));
  if (this_local == (HlslParseContext *)0x0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can\'t convert","constructor","");
    this_local = (HlslParseContext *)0x0;
  }
  else if (!subset) {
    if (this_local != (HlslParseContext *)node) {
      iVar2 = (*(this_local->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                [0x1e])();
      bVar1 = TType::operator==((TType *)CONCAT44(extraout_var_00,iVar2),type);
      if (bVar1) {
        return (TIntermTyped *)this_local;
      }
    }
    this_local = (HlslParseContext *)
                 TIntermediate::setAggregateOperator
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            (TIntermNode *)this_local,op,type,loc);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::constructBuiltIn(const TType& type, TOperator op, TIntermTyped* node,
                                                 const TSourceLoc& loc, bool subset)
{
    TIntermTyped* newNode;
    TOperator basicOp;

    //
    // First, convert types as needed.
    //
    switch (op) {
    case EOpConstructF16Vec2:
    case EOpConstructF16Vec3:
    case EOpConstructF16Vec4:
    case EOpConstructF16Mat2x2:
    case EOpConstructF16Mat2x3:
    case EOpConstructF16Mat2x4:
    case EOpConstructF16Mat3x2:
    case EOpConstructF16Mat3x3:
    case EOpConstructF16Mat3x4:
    case EOpConstructF16Mat4x2:
    case EOpConstructF16Mat4x3:
    case EOpConstructF16Mat4x4:
    case EOpConstructFloat16:
        basicOp = EOpConstructFloat16;
        break;

    case EOpConstructVec2:
    case EOpConstructVec3:
    case EOpConstructVec4:
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructFloat:
        basicOp = EOpConstructFloat;
        break;

    case EOpConstructDVec2:
    case EOpConstructDVec3:
    case EOpConstructDVec4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructDouble:
        basicOp = EOpConstructDouble;
        break;

    case EOpConstructI16Vec2:
    case EOpConstructI16Vec3:
    case EOpConstructI16Vec4:
    case EOpConstructInt16:
        basicOp = EOpConstructInt16;
        break;

    case EOpConstructIVec2:
    case EOpConstructIVec3:
    case EOpConstructIVec4:
    case EOpConstructIMat2x2:
    case EOpConstructIMat2x3:
    case EOpConstructIMat2x4:
    case EOpConstructIMat3x2:
    case EOpConstructIMat3x3:
    case EOpConstructIMat3x4:
    case EOpConstructIMat4x2:
    case EOpConstructIMat4x3:
    case EOpConstructIMat4x4:
    case EOpConstructInt:
        basicOp = EOpConstructInt;
        break;

    case EOpConstructU16Vec2:
    case EOpConstructU16Vec3:
    case EOpConstructU16Vec4:
    case EOpConstructUint16:
        basicOp = EOpConstructUint16;
        break;

    case EOpConstructUVec2:
    case EOpConstructUVec3:
    case EOpConstructUVec4:
    case EOpConstructUMat2x2:
    case EOpConstructUMat2x3:
    case EOpConstructUMat2x4:
    case EOpConstructUMat3x2:
    case EOpConstructUMat3x3:
    case EOpConstructUMat3x4:
    case EOpConstructUMat4x2:
    case EOpConstructUMat4x3:
    case EOpConstructUMat4x4:
    case EOpConstructUint:
        basicOp = EOpConstructUint;
        break;

    case EOpConstructBVec2:
    case EOpConstructBVec3:
    case EOpConstructBVec4:
    case EOpConstructBMat2x2:
    case EOpConstructBMat2x3:
    case EOpConstructBMat2x4:
    case EOpConstructBMat3x2:
    case EOpConstructBMat3x3:
    case EOpConstructBMat3x4:
    case EOpConstructBMat4x2:
    case EOpConstructBMat4x3:
    case EOpConstructBMat4x4:
    case EOpConstructBool:
        basicOp = EOpConstructBool;
        break;

    default:
        error(loc, "unsupported construction", "", "");

        return nullptr;
    }
    newNode = intermediate.addUnaryMath(basicOp, node, node->getLoc());
    if (newNode == nullptr) {
        error(loc, "can't convert", "constructor", "");
        return nullptr;
    }

    //
    // Now, if there still isn't an operation to do the construction, and we need one, add one.
    //

    // Otherwise, skip out early.
    if (subset || (newNode != node && newNode->getType() == type))
        return newNode;

    // setAggregateOperator will insert a new node for the constructor, as needed.
    return intermediate.setAggregateOperator(newNode, op, type, loc);
}